

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Socket.cpp
# Opt level: O2

void __thiscall Liby::Socket::setNonagle(Socket *this,bool flag)

{
  undefined4 in_EAX;
  int iVar1;
  __shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *p_Var2;
  ulong uVar3;
  ulong uStack_8;
  int nodelay;
  
  if (this->isUdp_ == true) {
    __assert_fail("!isUdp_",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                  ,100,"void Liby::Socket::setNonagle(bool)");
  }
  uStack_8 = (ulong)CONCAT14(flag,in_EAX);
  uVar3 = (ulong)(uint)this->fd_;
  p_Var2 = (__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)0x6;
  iVar1 = setsockopt(this->fd_,6,1,&nodelay,4);
  if (-1 < iVar1) {
    return;
  }
  throw_err();
  if (p_Var2->_M_ptr != (element_type *)0x0) {
    std::__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2>::operator=
              ((__shared_ptr<Liby::FileDescriptor,_(__gnu_cxx::_Lock_policy)2> *)(uVar3 + 8),p_Var2)
    ;
    *(int *)(uVar3 + 4) = p_Var2->_M_ptr->fd_;
    return;
  }
  __assert_fail("fp",
                "/workspace/llm4binary/github/license_all_cmakelists_25/ccsexyz[P]liby-cpp/src/Socket.cpp"
                ,0x76,"Socket &Liby::Socket::setFp(const fdPtr &)");
}

Assistant:

void Socket::setNonagle(bool flag) {
    assert(!isUdp_);
    int nodelay = flag ? 1 : 0;
    if (::setsockopt(fd_, IPPROTO_TCP, TCP_NODELAY, &nodelay, sizeof(int)) <
        0) {
        throw_err();
    }
}